

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmbench.c
# Opt level: O0

int main(int argc,char **argv)

{
  clock_t cVar1;
  clock_t cVar2;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar3;
  double dVar4;
  float buffer [32768];
  uint num_passes;
  double gen_time;
  double cpu_time;
  clock_t end;
  clock_t start;
  xm_context_t *ctx;
  size_t in_stack_fffffffffffdffc0;
  float *in_stack_fffffffffffdffc8;
  xm_context_t *in_stack_fffffffffffdffd0;
  uint32_t in_stack_fffffffffffdffdc;
  xm_context_t **in_stack_fffffffffffdffe0;
  uint local_44;
  long local_18;
  
  local_44 = 0;
  if (in_EDI != 2) {
    fprintf(_stderr,"Usage: %s <filename>\n",*in_RSI);
    fflush(_stderr);
    exit(1);
  }
  create_context_from_file
            (in_stack_fffffffffffdffe0,in_stack_fffffffffffdffdc,(char *)in_stack_fffffffffffdffd0);
  if (local_18 == 0) {
    exit(1);
  }
  cVar1 = clock();
  while( true ) {
    cVar2 = clock();
    if (4999999 < cVar2 - cVar1) break;
    local_44 = local_44 + 1;
    xm_generate_samples(in_stack_fffffffffffdffd0,in_stack_fffffffffffdffc8,
                        in_stack_fffffffffffdffc0);
  }
  cVar2 = clock();
  dVar3 = (double)(cVar2 - cVar1) / 1000000.0;
  dVar4 = ((double)local_44 * 32768.0) / 96000.0;
  printf("Generated %.2f second(s) of %iHz audio in %.2f CPU seconds, playback speed is %.2fx\n",
         dVar4,dVar3,dVar4 / dVar3,48000);
  xm_free_context((xm_context_t *)0x102407);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	xm_context_t* ctx;
	float buffer[buffer_size];
	clock_t start, end;
	double cpu_time, gen_time;
	unsigned int num_passes = 0;

	if(argc != 2)
		FATAL("Usage: %s <filename>\n", argv[0]);

	create_context_from_file(&ctx, rate, argv[1]);
	if(ctx == NULL) exit(1);

	start = clock();
	while((clock() - start) < ideal_running_time * CLOCKS_PER_SEC) {
		++num_passes;
		xm_generate_samples(ctx, buffer, sizeof(buffer) / (channels * sizeof(float)));
	}
	end = clock();

	cpu_time = (double)(end - start) / CLOCKS_PER_SEC;
	gen_time = (double)num_passes * (double)buffer_size / (channels * rate);
	printf("Generated %.2f second(s) of %iHz audio in %.2f CPU seconds, playback speed is %.2fx\n",
		   gen_time, rate, cpu_time, gen_time / cpu_time);

	xm_free_context(ctx);
	return 0;
}